

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O0

int Assimp::FBX::ParseTokenAsInt(Token *t)

{
  allocator local_41;
  string local_40;
  int local_1c;
  char *pcStack_18;
  int i;
  char *err;
  Token *t_local;
  
  err = (char *)t;
  local_1c = ParseTokenAsInt(t,&stack0xffffffffffffffe8);
  if (pcStack_18 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,pcStack_18,&local_41);
    anon_unknown.dwarf_1924db::ParseError(&local_40,(Token *)err);
  }
  return local_1c;
}

Assistant:

int ParseTokenAsInt(const Token& t)
{
    const char* err;
    const int i = ParseTokenAsInt(t,err);
    if(err) {
        ParseError(err,t);
    }
    return i;
}